

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_server.c
# Opt level: O0

void read_handler(cio_websocket *websocket,void *handler_context,cio_error err,size_t frame_length,
                 uint8_t *data,size_t chunk_length,_Bool last_chunk,_Bool last_frame,_Bool is_binary
                 )

{
  cio_error cVar1;
  size_t length;
  size_t frame_length_00;
  char *pcVar2;
  ws_echo_handler *echo_handler;
  cio_websocket_location_handler *handler;
  _Bool is_binary_local;
  _Bool last_frame_local;
  _Bool last_chunk_local;
  size_t chunk_length_local;
  uint8_t *data_local;
  size_t frame_length_local;
  cio_error err_local;
  void *handler_context_local;
  cio_websocket *websocket_local;
  
  if (err == CIO_SUCCESS) {
    pcVar2 = "false";
    if (last_frame) {
      pcVar2 = "true";
    }
    fprintf(_stdout,"Got text message (last frame: %s):",pcVar2);
    fwrite(data,chunk_length,1,_stdout);
    fflush(_stdout);
    fprintf(_stdout,"\n");
    cio_write_buffer_head_init((cio_write_buffer *)(websocket + 1));
    pcVar2 = read_handler::text_message;
    length = strlen(read_handler::text_message);
    cio_write_buffer_const_element_init
              ((cio_write_buffer *)&websocket[1].ws_private.read_handler_context,pcVar2,length);
    cio_write_buffer_queue_tail
              ((cio_write_buffer *)(websocket + 1),
               (cio_write_buffer *)&websocket[1].ws_private.read_handler_context);
    frame_length_00 = cio_write_buffer_get_total_size((cio_write_buffer *)(websocket + 1));
    cVar1 = cio_websocket_write_message_first_chunk
                      (websocket,frame_length_00,(cio_write_buffer *)(websocket + 1),true,is_binary,
                       write_complete,(void *)0x0);
    if (cVar1 != CIO_SUCCESS) {
      fprintf(_stderr,"Could not start writing message!\n");
    }
  }
  else if (err != CIO_EOF) {
    fprintf(_stderr,"read failure!\n");
  }
  return;
}

Assistant:

static void read_handler(struct cio_websocket *websocket, void *handler_context, enum cio_error err, size_t frame_length, uint8_t *data, size_t chunk_length, bool last_chunk, bool last_frame, bool is_binary)
{
	(void)handler_context;
	(void)frame_length;
	(void)last_chunk;

	if (err == CIO_SUCCESS) {
		struct cio_websocket_location_handler *handler = cio_container_of(websocket, struct cio_websocket_location_handler, websocket);
		struct ws_echo_handler *echo_handler = cio_container_of(handler, struct ws_echo_handler, ws_handler);

		(void)fprintf(stdout, "Got text message (last frame: %s):", last_frame ? "true" : "false");
		(void)fwrite(data, chunk_length, 1, stdout);
		(void)fflush(stdout);
		(void)fprintf(stdout, "\n");

		static const char *text_message = "Hello World!";
		cio_write_buffer_head_init(&echo_handler->wbh);
		cio_write_buffer_const_element_init(&echo_handler->wb_message, text_message, strlen(text_message));
		cio_write_buffer_queue_tail(&echo_handler->wbh, &echo_handler->wb_message);
		err = cio_websocket_write_message_first_chunk(websocket, cio_write_buffer_get_total_size(&echo_handler->wbh), &echo_handler->wbh, true, is_binary, write_complete, NULL);
		if (err != CIO_SUCCESS) {
			(void)fprintf(stderr, "Could not start writing message!\n");
		}
	} else if (err != CIO_EOF) {
		(void)fprintf(stderr, "read failure!\n");
	}
}